

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O2

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_1,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  ulong size_00;
  size_t size_01;
  double dVar1;
  long lVar2;
  LhsScalar *pLVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  long depth;
  long lVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  long lVar21;
  long j;
  long lVar22;
  long lVar23;
  long i3;
  long lVar24;
  double *pdVar25;
  long lVar26;
  double *pdVar27;
  double dVar28;
  double local_1b8;
  ptrdiff_t l1;
  ptrdiff_t l3;
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  ptrdiff_t l2;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  long local_d8;
  double *local_c0;
  long local_90;
  long cols;
  blas_data_mapper<double,_long,_0,_0> local_60;
  LhsScalar *local_50;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_0,_false,_true>
  local_41;
  double *pdStack_40;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_0,_false,_true>
  pack_rhs;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
  local_32;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
  local_31 [7];
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
  gebp_kernel;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
  pack_lhs;
  
  pdVar9 = &local_1b8;
  lVar2 = blocking->m_kc;
  lVar24 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    lVar24 = size;
  }
  pdVar25 = (double *)(lVar24 * lVar2);
  if ((ulong)pdVar25 >> 0x3d != 0) {
    throw_std_bad_alloc();
  }
  pdVar27 = (double *)(lVar2 * otherSize);
  local_50 = blocking->m_blockA;
  size_00 = (long)pdVar25 * 8;
  if (local_50 == (LhsScalar *)0x0) {
    if (size_00 < 0x20001) {
      l3 = (long)&local_1b8 - (size_00 + 0x1e & 0xfffffffffffffff0);
      blockA_stack_memory_destructor.m_size._0_1_ = false;
      pdVar9 = (double *)l3;
      local_50 = (LhsScalar *)l3;
    }
    else {
      local_50 = (LhsScalar *)aligned_malloc(size_00);
      l3 = (ptrdiff_t)(LhsScalar *)0x0;
      if (blocking->m_blockA == (LhsScalar *)0x0) {
        l3 = (ptrdiff_t)local_50;
      }
      blockA_stack_memory_destructor.m_size._0_1_ = true;
    }
  }
  else {
    blockA_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_00;
    l3 = 0;
    pdVar9 = &local_1b8;
  }
  blockA_stack_memory_destructor.m_ptr = pdVar25;
  if ((double *)0x1fffffffffffffff < pdVar27) {
    pdVar9[-1] = 6.81711778131752e-318;
    throw_std_bad_alloc();
  }
  size_01 = (long)pdVar27 * 8;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (size_01 < 0x20001) {
      pdVar9 = (double *)((long)pdVar9 - (size_01 + 0x1e & 0xfffffffffffffff0));
      blockA_stack_memory_destructor._16_8_ = pdVar9;
      cols = (long)pdVar9;
    }
    else {
      pdVar9[-1] = 6.81744386464378e-318;
      cols = (long)aligned_malloc(size_01);
      blockA_stack_memory_destructor._16_8_ = (undefined1 *)0x0;
      if (blocking->m_blockB == (RhsScalar *)0x0) {
        blockA_stack_memory_destructor._16_8_ = cols;
      }
    }
  }
  else {
    blockA_stack_memory_destructor._16_8_ = (undefined1 *)0x0;
    cols = (long)blocking->m_blockB;
  }
  blockB_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_01;
  blockB_stack_memory_destructor.m_ptr = pdVar27;
  *(undefined8 *)((long)pdVar9 + -8) = 0x150e61;
  manage_caching_sizes
            (GetAction,(ptrdiff_t *)&local_1b8,
             (ptrdiff_t *)&blockB_stack_memory_destructor.m_deallocate,&l1);
  *(undefined8 *)((long)pdVar9 + -8) = 4;
  lVar15 = *(long *)((long)pdVar9 + -8);
  if (otherSize < 1) {
    lVar4 = 0;
  }
  else {
    lVar4 = size;
    if (size < otherStride) {
      lVar4 = otherStride;
    }
    lVar4 = (long)((ulong)blockB_stack_memory_destructor._16_8_ / (ulong)(lVar4 << 5)) / lVar15 << 2
    ;
  }
  if (lVar4 < 5) {
    lVar4 = lVar15;
  }
  local_f8 = _tri + 1;
  lVar19 = lVar2 * (triStride * 8 + 8);
  local_f0 = _other + 1;
  local_e8 = _tri + lVar2;
  local_e0 = _other + lVar2;
  local_d8 = size - lVar2;
  local_90 = 0;
  lVar13 = size;
  while( true ) {
    lVar8 = lVar13;
    if (lVar2 < lVar13) {
      lVar8 = lVar2;
    }
    depth = size - local_90;
    if (depth == 0 || size < local_90) break;
    if (lVar2 < depth) {
      depth = lVar2;
    }
    local_c0 = local_f0;
    for (lVar12 = 0; lVar6 = otherSize - lVar12, lVar6 != 0 && lVar12 <= otherSize;
        lVar12 = lVar12 + lVar4) {
      if (lVar4 < lVar6) {
        lVar6 = lVar4;
      }
      pdVar25 = (double *)(cols + lVar12 * depth * 8);
      lVar21 = 0;
      lVar11 = lVar8;
      pdVar27 = local_c0;
      pdVar17 = local_f8;
      while( true ) {
        lVar5 = lVar15;
        if (lVar11 < 4) {
          lVar5 = lVar11;
        }
        lVar7 = 0;
        if (0 < lVar5) {
          lVar7 = lVar5;
        }
        lVar22 = depth - lVar21;
        if (lVar22 == 0 || depth < lVar21) break;
        pdStack_40 = (double *)(local_90 + lVar21);
        lVar15 = 0;
        pdVar10 = pdVar27;
        pdVar14 = pdVar17;
        while( true ) {
          lVar5 = lVar5 + -1;
          lVar16 = 0;
          if (0 < lVar5) {
            lVar16 = lVar5;
          }
          if (lVar15 == lVar7) break;
          lVar18 = local_90 + lVar21 + lVar15;
          dVar1 = _tri[lVar18 * triStride + lVar18];
          pdVar20 = pdVar10;
          for (lVar23 = lVar12; lVar23 < lVar6 + lVar12; lVar23 = lVar23 + 1) {
            dVar28 = _other[lVar23 * otherStride + lVar18] * (1.0 / dVar1);
            _other[lVar23 * otherStride + lVar18] = dVar28;
            for (lVar26 = 0; lVar16 != lVar26; lVar26 = lVar26 + 1) {
              pdVar20[lVar26] = pdVar14[lVar26] * -dVar28 + pdVar20[lVar26];
            }
            pdVar20 = pdVar20 + otherStride;
          }
          lVar15 = lVar15 + 1;
          pdVar14 = pdVar14 + triStride + 1;
          pdVar10 = pdVar10 + 1;
        }
        *(undefined8 *)((long)pdVar9 + -8) = 4;
        lVar15 = *(long *)((long)pdVar9 + -8);
        if (lVar22 < 4) {
          lVar15 = lVar22;
        }
        local_60.m_data = _other + (long)(lVar12 * otherStride + (long)pdStack_40);
        local_60.m_stride = otherStride;
        *(long *)((long)pdVar9 + -0x10) = lVar21;
        *(undefined8 *)((long)pdVar9 + -0x18) = 0x151199;
        gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_0,_false,_true>
        ::operator()(&local_41,pdVar25,&local_60,lVar15,lVar6,depth,*(long *)((long)pdVar9 + -0x10))
        ;
        pLVar3 = local_50;
        lVar22 = lVar22 - lVar15;
        if (0 < lVar22) {
          pdVar10 = (double *)(lVar15 + (long)pdStack_40);
          lVar5 = (long)pdStack_40 * triStride;
          pdStack_40 = pdVar10;
          local_60.m_data = _tri + (long)(lVar5 + (long)pdVar10);
          local_60.m_stride = triStride;
          *(undefined8 *)((long)pdVar9 + -0x10) = 0;
          *(undefined8 *)((long)pdVar9 + -0x18) = 0x151204;
          gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
          ::operator()(local_31,pLVar3,(const_blas_data_mapper<double,_long,_0> *)&local_60,lVar15,
                       lVar22,0,*(long *)((long)pdVar9 + -0x10));
          pLVar3 = local_50;
          local_60.m_data = _other + (long)(lVar12 * otherStride + (long)pdStack_40);
          local_60.m_stride = otherStride;
          *(long *)((long)pdVar9 + -0x10) = lVar21;
          *(undefined8 *)((long)pdVar9 + -0x18) = 0;
          *(long *)((long)pdVar9 + -0x20) = depth;
          *(long *)((long)pdVar9 + -0x28) = lVar15;
          *(long *)((long)pdVar9 + -0x30) = lVar6;
          *(undefined8 *)((long)pdVar9 + -0x38) = 0x15125b;
          gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
          ::operator()(&local_32,&local_60,pLVar3,pdVar25,lVar22,lVar15,
                       *(long *)((long)pdVar9 + -0x30),-1.0,*(long *)((long)pdVar9 + -0x28),
                       *(long *)((long)pdVar9 + -0x20),*(long *)((long)pdVar9 + -0x18),
                       *(long *)((long)pdVar9 + -0x10));
        }
        lVar21 = lVar21 + 4;
        lVar11 = lVar11 + -4;
        pdVar17 = pdVar17 + triStride * 4 + 4;
        pdVar27 = pdVar27 + 4;
        *(undefined8 *)((long)pdVar9 + -8) = 4;
        lVar15 = *(long *)((long)pdVar9 + -8);
      }
      local_c0 = local_c0 + otherStride * lVar4;
    }
    local_90 = local_90 + lVar2;
    pdVar25 = local_e0;
    pdVar27 = local_e8;
    lVar12 = local_d8;
    for (lVar8 = local_90; pLVar3 = local_50, lVar8 < size; lVar8 = lVar8 + lVar24) {
      lVar6 = lVar12;
      if (lVar24 <= lVar12) {
        lVar6 = lVar24;
      }
      if (0 < lVar6) {
        pdStack_40 = pdVar25;
        local_60.m_data = pdVar27;
        local_60.m_stride = triStride;
        *(undefined8 *)((long)pdVar9 + -0x10) = 0;
        *(undefined8 *)((long)pdVar9 + -0x18) = 0x151369;
        gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
        ::operator()(local_31,pLVar3,(const_blas_data_mapper<double,_long,_0> *)&local_60,depth,
                     lVar6,0,*(long *)((long)pdVar9 + -0x10));
        local_60.m_data = pdStack_40;
        local_60.m_stride = otherStride;
        *(undefined8 *)((long)pdVar9 + -0x18) = 0;
        *(undefined8 *)((long)pdVar9 + -0x10) = 0;
        *(undefined8 *)((long)pdVar9 + -0x20) = 0xffffffffffffffff;
        *(undefined8 *)((long)pdVar9 + -0x28) = 0xffffffffffffffff;
        *(long *)((long)pdVar9 + -0x30) = otherSize;
        pLVar3 = local_50;
        *(undefined8 *)((long)pdVar9 + -0x38) = 0x1513ba;
        gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
        ::operator()(&local_32,&local_60,pLVar3,(double *)cols,lVar6,depth,
                     *(long *)((long)pdVar9 + -0x30),-1.0,*(long *)((long)pdVar9 + -0x28),
                     *(long *)((long)pdVar9 + -0x20),*(long *)((long)pdVar9 + -0x18),
                     *(long *)((long)pdVar9 + -0x10));
        *(undefined8 *)((long)pdVar9 + -8) = 4;
        lVar15 = *(long *)((long)pdVar9 + -8);
        pdVar25 = pdStack_40;
      }
      pdVar27 = pdVar27 + lVar24;
      pdVar25 = pdVar25 + lVar24;
      lVar12 = lVar12 - lVar24;
    }
    lVar13 = lVar13 - lVar2;
    local_f8 = (double *)((long)local_f8 + lVar19);
    local_f0 = local_f0 + lVar2;
    local_e8 = (double *)((long)local_e8 + lVar19);
    local_e0 = local_e0 + lVar2;
    local_d8 = local_d8 - lVar2;
  }
  *(undefined8 *)((long)pdVar9 + -8) = 0x151458;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockA_stack_memory_destructor.m_deallocate);
  *(undefined8 *)((long)pdVar9 + -8) = 0x151464;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&l3);
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }